

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::MpRepeatedMessageOrGroup<true,true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  uint32_t uVar5;
  undefined1 auVar6 [16];
  int iVar7;
  void *pvVar8;
  RepeatedPtrFieldBase *pRVar9;
  MessageLite *msg_00;
  ushort *p;
  string *psVar10;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  char *pcVar11;
  ulong uVar12;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar13;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *ctx_00;
  ParseContext *extraout_RDX_01;
  ParseContext *extraout_RDX_02;
  uint uVar14;
  uint *puVar15;
  Arena *arena;
  int iVar16;
  long lVar17;
  long *plVar18;
  ushort uVar19;
  pair<const_char_*,_unsigned_int> pVar20;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_58;
  TcParser local_50 [16];
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_40;
  RepeatedPtrFieldBase *local_38;
  
  puVar15 = (uint *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  if (((ulong)puVar15 & 3) != 0) {
    AlignFail(puVar15);
  }
  uVar4 = *(ushort *)((long)puVar15 + 10);
  if ((ulong)(uVar4 & 0x30) == 0x20) {
    psVar10 = (string *)0x0;
  }
  else {
    psVar10 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                        ((ulong)(uVar4 & 0x30),0x20,
                         "type_card & field_layout::kFcMask == static_cast<uint16_t>(field_layout::kFcRepeated)"
                        );
  }
  if (psVar10 == (string *)0x0) {
    if ((ulong)(uVar4 & 0x1c0) == 0x40) {
      psVar10 = (string *)0x0;
    }
    else {
      psVar10 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                          ((ulong)(uVar4 & 0x1c0),0x40,
                           "type_card & field_layout::kRepMask == static_cast<uint16_t>(field_layout::kRepGroup)"
                          );
    }
    if (psVar10 == (string *)0x0) {
      if ((data.field_0._0_4_ & 7) != 3) {
        UNRECOVERED_JUMPTABLE = table->fallback;
        goto LAB_00163999;
      }
      pvVar8 = MaybeGetSplitBase(msg,true,table);
      plVar18 = (long *)((ulong)*puVar15 + (long)pvVar8);
      if (((ulong)plVar18 & 7) != 0) {
        AlignFail(plVar18);
      }
      if ((undefined1 *)*plVar18 == kZeroBuffer) {
        arena = (Arena *)(msg->_internal_metadata_).ptr_;
        if (((ulong)arena & 1) != 0) {
          arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
        }
        pRVar9 = Arena::CreateArenaCompatible<google::protobuf::internal::RepeatedPtrFieldBase>
                           (arena);
        *plVar18 = (long)pRVar9;
      }
      local_38 = (RepeatedPtrFieldBase *)*plVar18;
      local_58 = *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                  ((long)&table->has_bits_offset +
                  (ulong)(ushort)puVar15[2] * 8 + (ulong)table->aux_offset);
      uVar19 = uVar4 >> 9 & 3;
      local_40 = data.field_0;
      if (uVar19 != 2) {
        if ((uVar4 >> 9 & 3) == 0) {
          MpRepeatedMessageOrGroup<true,true>(local_50);
LAB_00163aab:
          local_58.data = *local_58.data;
        }
        else if (uVar19 != 1) goto LAB_00163aab;
        local_58.data = (uint64_t)MessageLite::GetTcParseTable(local_58.data);
      }
      do {
        pRVar9 = local_38;
        msg_00 = AddMessage((TcParseTableBase *)local_58,local_38);
        aVar13 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(long)ctx->depth_;
        lVar1 = aVar13.data - 1;
        iVar7 = (int)lVar1;
        ctx->depth_ = iVar7;
        if ((long)aVar13.data < 1) {
          p = (ushort *)0x0;
          ctx_00 = extraout_RDX;
        }
        else {
          lVar17 = (long)ctx->group_depth_ + 1;
          iVar16 = (int)lVar17;
          ctx->group_depth_ = iVar16;
          aVar13 = local_58;
          pRVar9 = (RepeatedPtrFieldBase *)ptr;
          p = (ushort *)ParseLoopPreserveNone(msg_00,ptr,ctx,(TcParseTableBase *)local_58);
          ctx_00 = extraout_RDX_00;
          if (p != (ushort *)0x0) {
            if (iVar7 == ctx->depth_) {
              psVar10 = (string *)0x0;
            }
            else {
              psVar10 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                                  (lVar1,(long)ctx->depth_,"old_depth == depth_");
              ctx_00 = extraout_RDX_01;
            }
            if (psVar10 == (string *)0x0) {
              pRVar9 = (RepeatedPtrFieldBase *)(long)ctx->group_depth_;
              if (iVar16 == ctx->group_depth_) {
                psVar10 = (string *)0x0;
              }
              else {
                psVar10 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                                    (lVar17,(long)pRVar9,"old_group_depth == group_depth_");
                ctx_00 = extraout_RDX_02;
              }
              if (psVar10 == (string *)0x0) goto LAB_001638c6;
            }
            else {
              MpRepeatedMessageOrGroup<true,true>();
            }
            MpRepeatedMessageOrGroup<true,true>();
            goto LAB_00163ae1;
          }
LAB_001638c6:
          ctx->group_depth_ = ctx->group_depth_ + -1;
          ctx->depth_ = ctx->depth_ + 1;
          uVar5 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
          msg_00 = (MessageLite *)0x0;
          data.field_0 = local_40;
          if (uVar5 != (uint32_t)local_40.data) {
            p = (ushort *)0x0;
          }
        }
        pVar20._8_8_ = ctx_00;
        pVar20.first = (char *)msg_00;
        if (p == (ushort *)0x0) {
          iVar7 = 8;
        }
        else if (p < (ctx->super_EpsCopyInputStream).limit_end_) {
          bVar2 = (byte)*p;
          puVar15 = (uint *)(ulong)bVar2;
          ptr = (char *)((long)p + 1);
          if ((char)bVar2 < '\0') {
            bVar3 = *(byte *)&((RepeatedPtrFieldBase *)ptr)->tagged_rep_or_elem_;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = ctx_00;
            pVar20 = (pair<const_char_*,_unsigned_int>)(auVar6 << 0x40);
            aVar13.data = (ulong)bVar3 << 7;
            uVar14 = ((uint)bVar2 + (uint)bVar3 * 0x80) - 0x80;
            puVar15 = (uint *)(ulong)uVar14;
            if ((char)bVar3 < '\0') {
              pRVar9 = (RepeatedPtrFieldBase *)(ulong)uVar14;
              pVar20 = ReadTagFallback((char *)p,uVar14);
              ptr = pVar20.first;
              puVar15 = (uint *)(ulong)pVar20.second;
            }
            else {
              ptr = (char *)(p + 1);
            }
          }
          ctx_00 = pVar20._8_8_;
          iVar7 = (uint)((RepeatedPtrFieldBase *)ptr == (RepeatedPtrFieldBase *)0x0) << 3;
        }
        else {
          iVar7 = 9;
        }
        if (iVar7 != 0) {
          if (iVar7 == 8) {
            pcVar11 = Error(msg,(char *)pRVar9,ctx_00,(TcFieldData)aVar13,table,hasbits);
            return pcVar11;
          }
          goto LAB_00163a0d;
        }
      } while ((int)puVar15 == SUB84(data.field_0.data,0));
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= p) {
LAB_00163a0d:
        if ((ulong)table->has_bits_offset != 0) {
          puVar15 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
          if (((ulong)puVar15 & 3) != 0) {
            AlignFail();
          }
          *puVar15 = *puVar15 | (uint)hasbits;
        }
        return (char *)p;
      }
      uVar14 = (uint)table->fast_idx_mask & (uint)*p;
      if ((uVar14 & 7) == 0) {
        uVar12 = (ulong)(uVar14 & 0xfffffff8);
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                       ((ulong)*p ^ *(ulong *)(&table[1].fast_idx_mask + uVar12 * 2));
        UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar12);
        ptr = (char *)p;
LAB_00163999:
        pcVar11 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,data,table,hasbits);
        return pcVar11;
      }
      goto LAB_00163afb;
    }
  }
  else {
LAB_00163ae1:
    MpRepeatedMessageOrGroup<true,true>();
  }
  MpRepeatedMessageOrGroup<true,true>();
LAB_00163afb:
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x44d);
}

Assistant:

const char* TcParser::MpRepeatedMessageOrGroup(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  ABSL_DCHECK_EQ(type_card & field_layout::kFcMask,
                 static_cast<uint16_t>(field_layout::kFcRepeated));
  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;

  // Validate wiretype:
  if (!is_group) {
    ABSL_DCHECK_EQ(type_card & field_layout::kRepMask,
                   static_cast<uint16_t>(field_layout::kRepMessage));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  } else {
    ABSL_DCHECK_EQ(type_card & field_layout::kRepMask,
                   static_cast<uint16_t>(field_layout::kRepGroup));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_START_GROUP) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  RepeatedPtrFieldBase& field =
      MaybeCreateRepeatedRefAt<RepeatedPtrFieldBase, is_split>(
          base, entry.offset, msg);
  const TcParseTableBase* inner_table =
      GetTableFromAux(type_card, *table->field_aux(&entry));

  const char* ptr2 = ptr;
  uint32_t next_tag;
  do {
    MessageLite* value = AddMessage(inner_table, field);
    const auto inner_loop = [&](const char* ptr) {
      return ParseLoopPreserveNone(value, ptr, ctx, inner_table);
    };
    ptr = is_group ? ctx->ParseGroupInlined(ptr2, decoded_tag, inner_loop)
                   : ctx->ParseLengthDelimitedInlined(ptr2, inner_loop);
    if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) goto error;
    if (PROTOBUF_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
    ptr2 = ReadTag(ptr, &next_tag);
    if (PROTOBUF_PREDICT_FALSE(ptr2 == nullptr)) goto error;
  } while (next_tag == decoded_tag);
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}